

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMinUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *dispatcher,bool updateOverlaps)

{
  short *psVar1;
  btOverlappingPairCallback *pbVar2;
  ushort uVar3;
  ulong uVar4;
  undefined6 in_register_00000012;
  unsigned_short *puVar5;
  Handle *handle1;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  short *psVar10;
  long lVar11;
  long lVar12;
  
  lVar9 = (long)axis;
  uVar4 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar3 = this->m_pEdges[lVar9][uVar4 + 1].m_handle;
  if (uVar3 != 0) {
    uVar8 = 1 << ((byte)axis & 0x1f) & 3;
    puVar5 = &this->m_pEdges[lVar9][uVar4].m_handle;
    uVar7 = 1 << (sbyte)uVar8 & 3;
    psVar10 = (short *)((long)this->m_pHandles->m_maxEdges +
                       lVar9 * 2 + (ulong)((uint)*puVar5 * 0x50) + -6);
    do {
      if (((Edge *)(puVar5 + -1))->m_pos < puVar5[1]) {
        return;
      }
      lVar6 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
              ((ulong)((uint)uVar3 * 0x50) - 0x1c);
      lVar12 = 0x3c;
      if (((((puVar5[1] & 1) != 0) && (lVar12 = 0x42, updateOverlaps)) &&
          (lVar11 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                    ((ulong)((uint)*puVar5 * 0x50) - 0x1c),
          *(ushort *)(lVar6 + 0x3c + (ulong)(uVar8 * 2)) <=
          *(ushort *)(lVar11 + 0x42 + (ulong)(uVar8 * 2)))) &&
         (((*(ushort *)(lVar11 + 0x3c + (ulong)(uVar8 * 2)) <=
            *(ushort *)(lVar6 + 0x42 + (ulong)(uVar8 * 2)) &&
           (uVar4 = (ulong)(uVar7 * 2),
           *(ushort *)(lVar6 + 0x3c + uVar4) <= *(ushort *)(lVar11 + 0x42 + uVar4))) &&
          (uVar4 = (ulong)(uVar7 * 2),
          *(ushort *)(lVar11 + 0x3c + uVar4) <= *(ushort *)(lVar6 + 0x42 + uVar4))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,lVar11,lVar6,dispatcher);
        pbVar2 = this->m_userPairCallback;
        if (pbVar2 != (btOverlappingPairCallback *)0x0) {
          (*pbVar2->_vptr_btOverlappingPairCallback[3])(pbVar2,lVar11,lVar6,dispatcher);
        }
      }
      psVar1 = (short *)(lVar6 + lVar12 + lVar9 * 2);
      *psVar1 = *psVar1 + -1;
      *psVar10 = *psVar10 + 1;
      *(ulong *)(puVar5 + -1) =
           CONCAT44((int)*(undefined8 *)(puVar5 + -1),
                    (int)((ulong)*(undefined8 *)(puVar5 + -1) >> 0x20));
      uVar3 = puVar5[4];
      puVar5 = puVar5 + 2;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}